

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateCreateTabbingRequest(void)

{
  bool bVar1;
  ImGuiDir move_dir;
  ImGuiKey unaff_retaddr;
  ImGuiDir clip_dir;
  ImGuiScrollFlags scroll_flags;
  bool tab_pressed;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiScrollFlags in_stack_ffffffffffffffd8;
  uint move_flags;
  uint in_stack_ffffffffffffffe0;
  uint clip_dir_00;
  ImGuiContext *pIVar2;
  
  if (((GImGui->NavWindow != (ImGuiWindow *)0x0) &&
      (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((GImGui->NavWindow->Flags & 0x40000U) == 0)) {
    pIVar2 = GImGui;
    bVar1 = IsKeyPressed(unaff_retaddr,(ImGuiID)((ulong)GImGui >> 0x20),(ImGuiInputFlags)GImGui);
    clip_dir_00 = in_stack_ffffffffffffffe0 & 0xffffff;
    if ((bVar1) &&
       (clip_dir_00 = in_stack_ffffffffffffffe0 & 0xffffff, ((pIVar2->IO).KeyCtrl & 1U) == 0)) {
      clip_dir_00 = CONCAT13((pIVar2->IO).KeyAlt,(int3)in_stack_ffffffffffffffe0) ^ 0xff000000;
    }
    if ((clip_dir_00 & 0x1000000) != 0) {
      if (((pIVar2->IO).KeyShift & 1U) == 0) {
        move_flags = (uint)(pIVar2->ActiveId != 0);
      }
      else {
        move_flags = 0xffffffff;
      }
      pIVar2->NavTabbingDir = move_flags;
      move_dir = 3;
      if (pIVar2->NavTabbingDir < 0) {
        move_dir = 2;
      }
      NavMoveRequestSubmit(move_dir,clip_dir_00,move_flags,in_stack_ffffffffffffffd8);
      pIVar2->NavTabbingCounter = -1;
    }
  }
  return;
}

Assistant:

void ImGui::NavUpdateCreateTabbingRequest()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.NavWindow;
    IM_ASSERT(g.NavMoveDir == ImGuiDir_None);
    if (window == NULL || g.NavWindowingTarget != NULL || (window->Flags & ImGuiWindowFlags_NoNavInputs))
        return;

    const bool tab_pressed = IsKeyPressed(ImGuiKey_Tab, ImGuiKeyOwner_None, ImGuiInputFlags_Repeat) && !g.IO.KeyCtrl && !g.IO.KeyAlt;
    if (!tab_pressed)
        return;

    // Initiate tabbing request
    // (this is ALWAYS ENABLED, regardless of ImGuiConfigFlags_NavEnableKeyboard flag!)
    // Initially this was designed to use counters and modulo arithmetic, but that could not work with unsubmitted items (list clipper). Instead we use a strategy close to other move requests.
    // See NavProcessItemForTabbingRequest() for a description of the various forward/backward tabbing cases with and without wrapping.
    //// FIXME: We use (g.ActiveId == 0) but (g.NavDisableHighlight == false) might be righter once we can tab through anything
    g.NavTabbingDir = g.IO.KeyShift ? -1 : (g.ActiveId == 0) ? 0 : +1;
    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    ImGuiDir clip_dir = (g.NavTabbingDir < 0) ? ImGuiDir_Up : ImGuiDir_Down;
    NavMoveRequestSubmit(ImGuiDir_None, clip_dir, ImGuiNavMoveFlags_Tabbing, scroll_flags); // FIXME-NAV: Once we refactor tabbing, add LegacyApi flag to not activate non-inputable.
    g.NavTabbingCounter = -1;
}